

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::capturedExpressionWithSecondArgument
                   (string *__return_storage_ptr__,string *capturedExpression,string *secondArg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((secondArg->_M_string_length != 0) && (bVar1 = std::operator==(secondArg,"\"\""), !bVar1)) {
    std::operator+(&local_48,capturedExpression,", ");
    std::operator+(__return_storage_ptr__,&local_48,secondArg);
    std::__cxx11::string::~string((string *)&local_48);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)capturedExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string capturedExpressionWithSecondArgument( std::string const& capturedExpression, std::string const& secondArg ) {
        return secondArg.empty() || secondArg == "\"\""
            ? capturedExpression
            : capturedExpression + ", " + secondArg;
    }